

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O2

int __thiscall CFtpTransfer::Receive(CFtpTransfer *this,int client_sockfd)

{
  ssize_t sVar1;
  ostream *poVar2;
  CFtpTransfer *this_00;
  CCommand *pCVar3;
  int in_ECX;
  CFtpTransfer *this_01;
  char buffer [4096];
  allocator local_1049;
  string local_1048;
  
  this_00 = (CFtpTransfer *)&stack0xffffffffffffefd8;
  this_01 = this_00;
  bzero(this_00,0x1000);
  sVar1 = ReceiveLine(this_01,client_sockfd,(char *)this_00,in_ECX);
  if (0 < sVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"From client command: ");
    poVar2 = std::operator<<(poVar2,&stack0xffffffffffffefd8);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (CFtpTransfer *)CManageClient::FindClient(&this->m_ClientManager,client_sockfd);
    std::__cxx11::string::string((string *)&local_1048,&stack0xffffffffffffefd8,&local_1049);
    pCVar3 = CManageClient::FindCommand(&this->m_ClientManager,&local_1048);
    std::__cxx11::string::~string((string *)&local_1048);
    if (pCVar3 == (CCommand *)0x0) goto LAB_001060e1;
    (*pCVar3->_vptr_CCommand[1])(pCVar3,this_00);
    CClient::GetClientState((CClient *)this_00);
  }
  CManageClient::EarseClient(&this->m_ClientManager,client_sockfd);
LAB_001060e1:
  sVar1 = CClient::sendErrorMsg((CClient *)this_00);
  std::__cxx11::string::~string((string *)&local_1048);
  _Unwind_Resume(sVar1);
}

Assistant:

int CFtpTransfer::Receive(const int client_sockfd) {
    long int n;
    char buffer[BUFFER_SIZE];
    bzero(buffer,BUFFER_SIZE);
    n = ReceiveLine(client_sockfd,buffer,BUFFER_SIZE);
    if(n > 0){
        cout << "From client command: " << buffer << endl;
        CClient *pClient = m_ClientManager.FindClient(client_sockfd);
        if(pClient){
            CCommand *pCommand = m_ClientManager.FindCommand(string(buffer));
            if(pCommand){
                pCommand->doWhat(pClient);
                EFTPSTATE state = pClient->GetClientState();
                if(state == QUIT){
                    m_ClientManager.EarseClient(client_sockfd);
                    m_CurrentConnetions--;
                    //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
                }
            }
            else{
                pClient->sendErrorMsg();
            }
        }
    }
    else{
        m_ClientManager.EarseClient(client_sockfd);
        m_CurrentConnetions--;
        //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
    }
}